

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial_device.cpp
# Opt level: O0

Vec2f embree::getTextureCoordinatesSubdivMesh(void *_mesh,uint primID,float u,float v)

{
  uint uVar1;
  Vec2f VVar2;
  uint in_EDX;
  long in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  Vec2f txt0_1;
  uint t3;
  uint t2_1;
  uint t1_1;
  uint t0_1;
  float w;
  Vec2f txt2;
  Vec2f txt1;
  Vec2f txt0;
  uint t2;
  uint t1;
  uint t0;
  uint face_offset;
  ISPCSubdivMesh *mesh;
  Vec2f *st;
  float local_2c0;
  float local_260;
  float v1;
  float u1;
  float v0;
  float u0;
  Vec2f txt3;
  Vec2f txt2_1;
  
  *in_RDI = in_XMM0_Da;
  in_RDI[1] = in_XMM1_Da;
  if ((in_RSI != 0) && (*(long *)(in_RSI + 0x40) != 0)) {
    uVar1 = *(uint *)(*(long *)(in_RSI + 0x90) + (ulong)in_EDX * 4);
    if (*(int *)(*(long *)(in_RSI + 0x58) + (ulong)in_EDX * 4) == 3) {
      *in_RDI = ((1.0 - in_XMM0_Da) - in_XMM1_Da) *
                *(float *)(*(long *)(in_RSI + 0x28) +
                          (ulong)*(uint *)(*(long *)(in_RSI + 0x40) + (ulong)uVar1 * 4) * 8) +
                in_XMM0_Da *
                *(float *)(*(long *)(in_RSI + 0x28) +
                          (ulong)*(uint *)(*(long *)(in_RSI + 0x40) + (ulong)(uVar1 + 1) * 4) * 8) +
                in_XMM1_Da *
                *(float *)(*(long *)(in_RSI + 0x28) +
                          (ulong)*(uint *)(*(long *)(in_RSI + 0x40) + (ulong)(uVar1 + 2) * 4) * 8);
      in_RDI[1] = local_260;
      in_XMM1_Da = local_260;
    }
    else if (*(int *)(*(long *)(in_RSI + 0x58) + (ulong)in_EDX * 4) == 4) {
      *in_RDI = (1.0 - in_XMM0_Da) * (1.0 - in_XMM1_Da) *
                *(float *)(*(long *)(in_RSI + 0x28) +
                          (ulong)*(uint *)(*(long *)(in_RSI + 0x40) + (ulong)uVar1 * 4) * 8) +
                in_XMM0_Da * (1.0 - in_XMM1_Da) *
                *(float *)(*(long *)(in_RSI + 0x28) +
                          (ulong)*(uint *)(*(long *)(in_RSI + 0x40) + (ulong)(uVar1 + 1) * 4) * 8) +
                in_XMM0_Da * in_XMM1_Da *
                *(float *)(*(long *)(in_RSI + 0x28) +
                          (ulong)*(uint *)(*(long *)(in_RSI + 0x40) + (ulong)(uVar1 + 2) * 4) * 8) +
                (1.0 - in_XMM0_Da) * in_XMM1_Da *
                *(float *)(*(long *)(in_RSI + 0x28) +
                          (ulong)*(uint *)(*(long *)(in_RSI + 0x40) + (ulong)(uVar1 + 3) * 4) * 8);
      in_RDI[1] = local_2c0;
      in_XMM1_Da = local_2c0;
    }
  }
  VVar2.field_0.field_0.y = 0.0;
  VVar2.field_0.field_0.x = in_XMM1_Da;
  return (Vec2f)VVar2.field_0;
}

Assistant:

Vec2f getTextureCoordinatesSubdivMesh(void* _mesh, const unsigned int primID, const float u, const float v)
{
  ISPCSubdivMesh *mesh = (ISPCSubdivMesh *)_mesh;
  Vec2f st;
  st.x = u;
  st.y = v;
  if (mesh && mesh->texcoord_indices)
    {
      assert(primID < mesh->numFaces);
      const unsigned int face_offset = mesh->face_offsets[primID];
      if (mesh->verticesPerFace[primID] == 3)
	{
	  const unsigned int t0 = mesh->texcoord_indices[face_offset+0];
	  const unsigned int t1 = mesh->texcoord_indices[face_offset+1];
	  const unsigned int t2 = mesh->texcoord_indices[face_offset+2];
	  const Vec2f txt0 = mesh->texcoords[t0];
	  const Vec2f txt1 = mesh->texcoords[t1];
	  const Vec2f txt2 = mesh->texcoords[t2];
	  const float w = 1.0f - u - v;
	  st = w * txt0 + u * txt1 + v * txt2;
	}
      else if (mesh->verticesPerFace[primID] == 4)
	{
	  const unsigned int t0 = mesh->texcoord_indices[face_offset+0];
	  const unsigned int t1 = mesh->texcoord_indices[face_offset+1];
	  const unsigned int t2 = mesh->texcoord_indices[face_offset+2];
	  const unsigned int t3 = mesh->texcoord_indices[face_offset+3];
	  const Vec2f txt0 = mesh->texcoords[t0];
	  const Vec2f txt1 = mesh->texcoords[t1];
	  const Vec2f txt2 = mesh->texcoords[t2];
	  const Vec2f txt3 = mesh->texcoords[t3];
	  const float u0 = u;
	  const float v0 = v;
	  const float u1 = 1.0f - u;
	  const float v1 = 1.0f - v;
	  st = u1*v1 * txt0 + u0*v1* txt1 + u0*v0 * txt2 + u1*v0* txt3;
	}
    }
  return st;
}